

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O2

void doInsertionSort(char *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                    void *pv)

{
  ulong __n;
  uint uVar1;
  char *item;
  long lVar2;
  long lVar3;
  uint uVar4;
  char *__src;
  
  __n = (ulong)(uint)itemSize;
  item = array + itemSize;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    uVar1 = uprv_stableBinarySearch_63(array,(int32_t)lVar2,item,itemSize,cmp,context);
    uVar4 = ~uVar1;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1 + 1;
    }
    lVar3 = lVar2 - (int)uVar4;
    if (lVar3 != 0 && (int)uVar4 <= lVar2) {
      __src = array + uVar4 * itemSize;
      memcpy(pv,item,__n);
      memmove(__src + __n,__src,lVar3 * __n);
      memcpy(__src,pv,__n);
    }
    item = item + itemSize;
  }
  return;
}

Assistant:

static void
doInsertionSort(char *array, int32_t length, int32_t itemSize,
                UComparator *cmp, const void *context, void *pv) {
    int32_t j;

    for(j=1; j<length; ++j) {
        char *item=array+j*itemSize;
        int32_t insertionPoint=uprv_stableBinarySearch(array, j, item, itemSize, cmp, context);
        if(insertionPoint<0) {
            insertionPoint=~insertionPoint;
        } else {
            ++insertionPoint;  /* one past the last equal item */
        }
        if(insertionPoint<j) {
            char *dest=array+insertionPoint*itemSize;
            uprv_memcpy(pv, item, itemSize);  /* v=array[j] */
            uprv_memmove(dest+itemSize, dest, (j-insertionPoint)*(size_t)itemSize);
            uprv_memcpy(dest, pv, itemSize);  /* array[insertionPoint]=v */
        }
    }
}